

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

int extensionSupportedGLX(char *extension)

{
  GLFWbool GVar1;
  char *extensions_00;
  char *extensions;
  char *extension_local;
  
  extensions_00 = (*_glfw.glx.QueryExtensionsString)(_glfw.x11.display,_glfw.x11.screen);
  if ((extensions_00 == (char *)0x0) ||
     (GVar1 = _glfwStringInExtensionString(extension,extensions_00), GVar1 == 0)) {
    extension_local._4_4_ = 0;
  }
  else {
    extension_local._4_4_ = 1;
  }
  return extension_local._4_4_;
}

Assistant:

static int extensionSupportedGLX(const char* extension)
{
    const char* extensions =
        glXQueryExtensionsString(_glfw.x11.display, _glfw.x11.screen);
    if (extensions)
    {
        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}